

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O2

void __thiscall helics::Federate::localError(Federate *this,int errorcode)

{
  string_view message;
  string errorString;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  CLI::std::__cxx11::to_string(&local_38,errorcode);
  std::operator+(&local_78,"local error ",&local_38);
  std::operator+(&local_58,&local_78," in federate ");
  std::operator+(&local_98,&local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->mName);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_38);
  message._M_str = local_98._M_dataplus._M_p;
  message._M_len = local_98._M_string_length;
  localError(this,errorcode,message);
  std::__cxx11::string::~string((string *)&local_98);
  return;
}

Assistant:

void Federate::localError(int errorcode)
{
    const std::string errorString =
        "local error " + std::to_string(errorcode) + " in federate " + mName;
    localError(errorcode, errorString);
}